

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

int rtosc_count_printed_arg_vals(char *src)

{
  int iVar1;
  ushort **ppuVar2;
  char *src_00;
  char *pcVar3;
  char *llhssrc;
  _func_int_int *in_RSI;
  _func_int_int *property;
  int iVar4;
  ulong uVar5;
  char *src_local;
  int skipped_now;
  
  src_local = src;
  skip_while(&src_local,in_RSI);
  while (*src_local == '%') {
    skip_fmt(&src_local,"%*[^\n] %n");
  }
  skipped_now = 0;
  iVar4 = 0;
  pcVar3 = src_local;
  llhssrc = (char *)0x0;
  while (((src_00 = pcVar3, src_00 != (char *)0x0 && (*src_00 != '\0')) && (*src_00 != '/'))) {
    property = (_func_int_int *)&skipped_now;
    src_local = rtosc_skip_next_printed_arg(src_00,(int *)property,(char *)0x0,llhssrc,1,0);
    pcVar3 = (char *)0x0;
    if (src_local != (char *)0x0) {
      skip_while(&src_local,property);
      pcVar3 = src_local;
      uVar5 = (ulong)*src_local;
      if (uVar5 != 0) {
        ppuVar2 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar2 + uVar5 * 2 + 1) & 0x20) == 0) {
          while ((char)uVar5 == '%') {
            skip_fmt(&src_local,"%*[^\n] %n");
            pcVar3 = src_local;
            uVar5 = (ulong)(byte)*src_local;
          }
        }
      }
    }
    iVar4 = iVar4 + skipped_now;
    llhssrc = src_00;
  }
  iVar1 = -iVar4;
  if (src_00 != (char *)0x0) {
    iVar1 = iVar4;
  }
  return iVar1;
}

Assistant:

int rtosc_count_printed_arg_vals(const char* src)
{
    int num = 0;

    skip_while(&src, isspace);
    while (*src == '%')
        skip_fmt(&src, "%*[^\n] %n");

    int skipped_now = 0;
    const char* recent_src = NULL;
    for(; src && *src && *src != '/'; num += skipped_now)
    {
        const char* newsrc = rtosc_skip_next_printed_arg(src, &skipped_now,
                                                         NULL, recent_src, 1,
                                                         0);
        recent_src = src;
        src = newsrc;

        if(src) // no parse error
        {
            skip_while(&src, isspace);
            if(*src && !isspace(*src))
            {
                while (*src == '%')
                    skip_fmt(&src, "%*[^\n] %n");
            }
        }
    }
    return src ? num : -num;
}